

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O1

void __thiscall QToolButton::actionEvent(QToolButton *this,QActionEvent *event)

{
  short sVar1;
  long lVar2;
  QObject *action;
  void **ppvVar3;
  int *piVar4;
  undefined4 *puVar5;
  QObject *pQVar6;
  long in_FS_OFFSET;
  Connection local_60;
  code *local_58;
  ImplFn local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  action = *(QObject **)(event + 0x10);
  sVar1 = *(short *)(event + 8);
  if (sVar1 == 0x73) {
    if (*(QObject **)(lVar2 + 0x2f0) == action) {
      *(undefined8 *)(lVar2 + 0x2f0) = 0;
    }
    piVar4 = *(int **)(lVar2 + 0x2c8);
    if ((piVar4 == (int *)0x0) || (piVar4[1] == 0)) {
      pQVar6 = (QObject *)0x0;
    }
    else {
      pQVar6 = *(QObject **)(lVar2 + 0x2d0);
    }
    if (pQVar6 == action) {
      *(undefined8 *)(lVar2 + 0x2c8) = 0;
      *(undefined8 *)(lVar2 + 0x2d0) = 0;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          operator_delete(piVar4);
        }
      }
    }
    QObject::disconnect(action,(char *)0x0,(QObject *)this,(char *)0x0);
  }
  else if (sVar1 == 0x72) {
    local_48 = QAction::triggered;
    local_40 = 0;
    local_58 = QToolButtonPrivate::onActionTriggered;
    local_50 = (ImplFn)0x0;
    ppvVar3 = *(void ***)(lVar2 + 8);
    puVar5 = (undefined4 *)operator_new(0x20);
    *puVar5 = 1;
    *(code **)(puVar5 + 2) =
         QtPrivate::QPrivateSlotObject<void_(QToolButtonPrivate::*)(),_QtPrivate::List<>,_void>::
         impl;
    *(code **)(puVar5 + 4) = QToolButtonPrivate::onActionTriggered;
    *(undefined8 *)(puVar5 + 6) = 0;
    QObject::connectImpl
              ((QObject *)&local_60,(void **)action,(QObject *)&local_48,ppvVar3,
               (QSlotObjectBase *)&local_58,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection(&local_60);
  }
  else if ((sVar1 == 0x71) && (action == *(QObject **)(lVar2 + 0x2f0))) {
    setDefaultAction(this,(QAction *)action);
  }
  QWidget::actionEvent((QWidget *)this,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolButton::actionEvent(QActionEvent *event)
{
    Q_D(QToolButton);
    auto action = static_cast<QAction *>(event->action());
    switch (event->type()) {
    case QEvent::ActionChanged:
        if (action == d->defaultAction)
            setDefaultAction(action); // update button state
        break;
    case QEvent::ActionAdded:
        QObjectPrivate::connect(action, &QAction::triggered, d,
                                &QToolButtonPrivate::onActionTriggered);
        break;
    case QEvent::ActionRemoved:
        if (d->defaultAction == action)
            d->defaultAction = nullptr;
#if QT_CONFIG(menu)
        if (action == d->menuAction)
            d->menuAction = nullptr;
#endif
        action->disconnect(this);
        break;
    default:
        ;
    }
    QAbstractButton::actionEvent(event);
}